

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int time_season(void)

{
  int iVar1;
  tm *ptVar2;
  long in_FS_OFFSET;
  time_t time_data;
  time_t tStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  time(&tStack_18);
  ptVar2 = localtime(&tStack_18);
  iVar1 = 0;
  if ((ulong)(uint)ptVar2->tm_mon < 0xc) {
    iVar1 = *(int *)(&DAT_0014f7f8 + (ulong)(uint)ptVar2->tm_mon * 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int time_season()
{
	time_t time_data;
	struct tm *time_info;

	time(&time_data);
	time_info = localtime(&time_data);

	switch(time_info->tm_mon)
	{
		case 11:
		case 0:
		case 1:
			return SEASON_WINTER;
		case 2:
		case 3:
		case 4:
			return SEASON_SPRING;
		case 5:
		case 6:
		case 7:
			return SEASON_SUMMER;
		case 8:
		case 9:
		case 10:
			return SEASON_AUTUMN;
	}
	return SEASON_SPRING; // should never happen
}